

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::GetMessage
          (ExtensionSet *this,int number,MessageLite *default_value)

{
  byte bVar1;
  int iVar2;
  _Base_ptr p_Var3;
  LogMessage *pLVar4;
  undefined4 extraout_var;
  _Rb_tree_header *p_Var6;
  _Base_ptr p_Var7;
  LogFinisher local_59;
  LogMessage local_58;
  _Base_ptr p_Var5;
  
  p_Var3 = (this->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var5 = (_Base_ptr)default_value;
  if (p_Var3 != (_Base_ptr)0x0) {
    p_Var6 = &(this->extensions_)._M_t._M_impl.super__Rb_tree_header;
    p_Var7 = &p_Var6->_M_header;
    do {
      if (number <= (int)p_Var3[1]._M_color) {
        p_Var7 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < number];
    } while (p_Var3 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var7 != p_Var6) && ((int)p_Var7[1]._M_color <= number)) {
      if (*(char *)((long)&p_Var7[1]._M_left + 1) != '\0') {
        LogMessage::LogMessage
                  (&local_58,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                   ,0x1bb);
        pLVar4 = LogMessage::operator<<
                           (&local_58,
                            "CHECK failed: ((iter->second).is_repeated ? REPEATED : OPTIONAL) == (OPTIONAL): "
                           );
        LogFinisher::operator=(&local_59,pLVar4);
        LogMessage::~LogMessage(&local_58);
      }
      bVar1 = *(byte *)&p_Var7[1]._M_left;
      if ((byte)(bVar1 - 0x13) < 0xee) {
        LogMessage::LogMessage
                  (&local_58,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                   ,0x35);
        pLVar4 = LogMessage::operator<<
                           (&local_58,
                            "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
        LogFinisher::operator=(&local_59,pLVar4);
        LogMessage::~LogMessage(&local_58);
      }
      if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) != 10) {
        LogMessage::LogMessage
                  (&local_58,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                   ,0x1bb);
        pLVar4 = LogMessage::operator<<
                           (&local_58,
                            "CHECK failed: (cpp_type((iter->second).type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                           );
        LogFinisher::operator=(&local_59,pLVar4);
        LogMessage::~LogMessage(&local_58);
      }
      p_Var5 = p_Var7[1]._M_parent;
      if (((ulong)p_Var7[1]._M_left & 0x100000) != 0) {
        iVar2 = (*(*(_func_int ***)p_Var5)[3])(p_Var5,default_value);
        p_Var5 = (_Base_ptr)CONCAT44(extraout_var,iVar2);
      }
    }
  }
  return (MessageLite *)p_Var5;
}

Assistant:

const MessageLite& ExtensionSet::GetMessage(
    int number, const MessageLite& default_value) const {
  map<int, Extension>::const_iterator iter = extensions_.find(number);
  if (iter == extensions_.end()) {
    // Not present.  Return the default value.
    return default_value;
  } else {
    GOOGLE_DCHECK_TYPE(iter->second, OPTIONAL, MESSAGE);
    if (iter->second.is_lazy) {
      return iter->second.lazymessage_value->GetMessage(default_value);
    } else {
      return *iter->second.message_value;
    }
  }
}